

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

App * __thiscall CLI::App::get_subcommand(App *this,App *subcom)

{
  __uniq_ptr_data<CLI::App,_std::default_delete<CLI::App>,_true,_true> *p_Var1;
  OptionNotFound *this_00;
  pointer puVar2;
  string sStack_38;
  
  puVar2 = (this->subcommands_).
           super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (puVar2 == (this->subcommands_).
                  super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      this_00 = (OptionNotFound *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string((string *)&sStack_38,(string *)&subcom->name_);
      OptionNotFound::OptionNotFound(this_00,&sStack_38);
      __cxa_throw(this_00,&OptionNotFound::typeinfo,Error::~Error);
    }
    p_Var1 = &puVar2->_M_t;
    puVar2 = puVar2 + 1;
  } while ((p_Var1->super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>)._M_t.
           super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
           super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl != subcom);
  return subcom;
}

Assistant:

App *get_subcommand(App *subcom) const {
        for(const App_p &subcomptr : subcommands_)
            if(subcomptr.get() == subcom)
                return subcom;
        throw OptionNotFound(subcom->get_name());
    }